

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2203::generate(ym2203 *this,output_data *output,uint32_t numsamples)

{
  uint32_t uVar1;
  uint uVar2;
  uint local_24;
  uint32_t step;
  uint32_t samp_1;
  uint32_t samp;
  uint32_t numsamples_local;
  output_data *output_local;
  ym2203 *this_local;
  
  _samp = output;
  if (this->m_fm_samples_per_output == '\0') {
    for (local_24 = 0; local_24 < numsamples; local_24 = local_24 + 1) {
      uVar1 = ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::sampindex(&this->m_ssg_resampler);
      uVar2 = (uVar1 + local_24) % 3;
      if (uVar2 == 0) {
        clock_fm(this);
      }
      _samp->data[0] = (this->m_last_fm).data[0];
      if (uVar2 == 1) {
        clock_fm(this);
        _samp->data[0] = (_samp->data[0] + (this->m_last_fm).data[0]) / 2;
      }
      _samp = _samp + 1;
    }
  }
  else {
    for (step = 0; step < numsamples; step = step + 1) {
      uVar1 = ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::sampindex(&this->m_ssg_resampler);
      if ((uVar1 + step) % (uint)this->m_fm_samples_per_output == 0) {
        clock_fm(this);
      }
      _samp->data[0] = (this->m_last_fm).data[0];
      _samp = _samp + 1;
    }
  }
  ssg_resampler<ymfm::ymfm_output<4>,_1,_false>::resample
            (&this->m_ssg_resampler,_samp + -(ulong)numsamples,numsamples);
  return;
}

Assistant:

void ym2203::generate(output_data *output, uint32_t numsamples)
{
	// FM output is just repeated the prescale number of times; note that
	// 0 is a special 1.5 case
	if (m_fm_samples_per_output != 0)
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			if ((m_ssg_resampler.sampindex() + samp) % m_fm_samples_per_output == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
		}
	}
	else
	{
		for (uint32_t samp = 0; samp < numsamples; samp++, output++)
		{
			uint32_t step = (m_ssg_resampler.sampindex() + samp) % 3;
			if (step == 0)
				clock_fm();
			output->data[0] = m_last_fm.data[0];
			if (step == 1)
			{
				clock_fm();
				output->data[0] = (output->data[0] + m_last_fm.data[0]) / 2;
			}
		}
	}

	// resample the SSG as configured
	m_ssg_resampler.resample(output - numsamples, numsamples);
}